

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::ConnectTip
          (Chainstate *this,BlockValidationState *state,CBlockIndex *pindexNew,
          shared_ptr<const_CBlock> *pblock,ConnectTrace *connectTrace,
          DisconnectedBlockTransactions *disconnectpool)

{
  duration *pdVar1;
  pointer ppCVar2;
  Notifications *notifications;
  ValidationSignals *this_00;
  ChainstateManager *pCVar3;
  string_view source_file;
  element_type *block;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  CCoinsViewCache *baseIn;
  long lVar8;
  Logger *pLVar9;
  Chainstate *pCVar10;
  CBlockIndex *pCVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  byte unaff_R12B;
  long in_FS_OFFSET;
  double dVar12;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  shared_ptr<const_CBlock> pblock_00;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  Level level;
  char *pcVar13;
  double *pdVar14;
  element_type *local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_320;
  shared_ptr<const_CBlock> pthisBlock;
  string local_300;
  base_blob<256u> local_2e0 [32];
  string local_2c0;
  CCoinsViewCache view;
  double local_98 [4];
  string local_78;
  shared_ptr<CBlock> pblockNew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar2 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar11 = (CBlockIndex *)0x0;
  }
  else {
    pCVar11 = ppCVar2[-1];
  }
  if (pindexNew->pprev != pCVar11) {
    __assert_fail("pindexNew->pprev == m_chain.Tip()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0xc47,
                  "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                 );
  }
  lVar6 = std::chrono::_V2::steady_clock::now();
  pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::make_shared<CBlock>();
    bVar4 = ::node::BlockManager::ReadBlockFromDisk
                      (this->m_blockman,
                       pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       pindexNew);
    if (bVar4) {
      std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)&pthisBlock,
                 &pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      notifications = (this->m_chainman->m_options).notifications;
      _((bilingual_str *)&view,(ConstevalStringLiteral)0xce6dac);
      unaff_R12B = FatalError(notifications,state,(bilingual_str *)&view);
      bilingual_str::~bilingual_str((bilingual_str *)&view);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (!bVar4) goto LAB_008be9f4;
  }
  else {
    bVar4 = ::LogAcceptCategory(BENCH,Debug);
    if (bVar4) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x57;
      logging_function._M_str = "ConnectTip";
      logging_function._M_len = 10;
      ::LogPrintf_<>(logging_function,source_file_00,0xc52,BENCH,Debug,"  - Using cached block\n");
    }
    std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
               &pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
  }
  block = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar7 = std::chrono::_V2::steady_clock::now();
  pcVar13 = (char *)0x8be332;
  bVar4 = ::LogAcceptCategory(BENCH,Debug);
  if (bVar4) {
    view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
         (_func_int **)((double)(lVar7 - lVar6) / 1000000.0);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file_01._M_len = 0x57;
    logging_function_00._M_str = "ConnectTip";
    logging_function_00._M_len = 10;
    LogPrintf_<double>(logging_function_00,source_file_01,0xc5c,
                       IPC|I2P|QT|COINDB|LIBEVENT|PRUNE|RAND|REINDEX|SELECTCOINS|ESTIMATEFEE|RPC|
                       WALLETDB|ZMQ|MEMPOOL|NET,(Level)&view,pcVar13,(double *)state);
  }
  baseIn = CoinsTip(this);
  CCoinsViewCache::CCoinsViewCache(&view,(CCoinsView *)baseIn,false);
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar4 = ConnectBlock(this,block,state,pindexNew,&view,false);
  this_00 = (this->m_chainman->m_options).signals;
  if (this_00 != (ValidationSignals *)0x0) {
    ValidationSignals::BlockChecked(this_00,block,state);
  }
  if (bVar4) {
    lVar8 = std::chrono::_V2::steady_clock::now();
    pCVar3 = this->m_chainman;
    pdVar1 = &pCVar3->time_connect_total;
    pdVar1->__r = pdVar1->__r + (lVar8 - lVar7);
    if (pCVar3->num_blocks_total < 1) {
      __assert_fail("m_chainman.num_blocks_total > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                    ,0xc6b,
                    "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                   );
    }
    pdVar14 = (double *)0x8be41e;
    bVar5 = ::LogAcceptCategory(BENCH,Debug);
    if (bVar5) {
      pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)((double)(lVar8 - lVar7) / 1000000.0);
      dVar12 = (double)(this->m_chainman->time_connect_total).__r;
      local_78._M_dataplus._M_p = (pointer)(dVar12 / 1000000000.0);
      local_98[0] = (dVar12 / 1000000.0) / (double)this->m_chainman->num_blocks_total;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_02._M_len = 0x57;
      logging_function_01._M_str = "ConnectTip";
      logging_function_01._M_len = 10;
      LogPrintf_<double,double,double>
                (logging_function_01,source_file_02,0xc6f,
                 IPC|I2P|QT|COINDB|LIBEVENT|PRUNE|RAND|REINDEX|SELECTCOINS|ADDRMAN|WALLETDB|MEMPOOL|
                 TOR|NET,(Level)&pblockNew,(char *)&local_78,local_98,pdVar14,(double *)state);
    }
    bVar5 = CCoinsViewCache::Flush(&view);
    if (!bVar5) {
      __assert_fail("flushed",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                    ,0xc71,
                    "bool Chainstate::ConnectTip(BlockValidationState &, CBlockIndex *, const std::shared_ptr<const CBlock> &, ConnectTrace &, DisconnectedBlockTransactions &)"
                   );
    }
  }
  else {
    if (((ValidationState<BlockValidationResult> *)
        &(state->super_ValidationState<BlockValidationResult>).m_mode)->m_mode == M_INVALID) {
      InvalidBlockFound(this,pindexNew,state);
    }
    CBlockIndex::GetBlockHash((uint256 *)local_2e0,pindexNew);
    base_blob<256u>::ToString_abi_cxx11_(&local_2c0,local_2e0);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_300,&state->super_ValidationState<BlockValidationResult>);
    pLVar9 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar9);
    if (bVar5) {
      pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_48;
      pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48._M_local_buf[0] = '\0';
      tinyformat::format<char[11],std::__cxx11::string,std::__cxx11::string>
                (&local_78,(tinyformat *)"%s: ConnectBlock %s failed, %s\n","ConnectTip",
                 (char (*) [11])&local_2c0,&local_300,args_2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pblockNew,
                 &local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pLVar9 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x57;
      local_78._M_string_length = 0xce5cd9;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = (char *)pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      str._M_len = (size_t)pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
      logging_function_06._M_str = "ConnectTip";
      logging_function_06._M_len = 10;
      BCLog::Logger::LogPrintStr(pLVar9,str,logging_function_06,source_file,0xc66,ALL,Error);
      std::__cxx11::string::~string((string *)&pblockNew);
    }
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2c0);
    lVar8 = 0;
    unaff_R12B = 0;
  }
  CCoinsViewCache::~CCoinsViewCache(&view);
  if (bVar4) {
    lVar7 = std::chrono::_V2::steady_clock::now();
    pdVar1 = &this->m_chainman->time_flush;
    pdVar1->__r = pdVar1->__r + (lVar7 - lVar8);
    pdVar14 = (double *)0x8be680;
    bVar4 = ::LogAcceptCategory(BENCH,Debug);
    level = (Level)&view;
    if (bVar4) {
      view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
           (_func_int **)((double)(lVar7 - lVar8) / 1000000.0);
      dVar12 = (double)(this->m_chainman->time_flush).__r;
      pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(dVar12 / 1000000000.0);
      local_78._M_dataplus._M_p =
           (pointer)((dVar12 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_03._M_len = 0x57;
      logging_function_02._M_str = "ConnectTip";
      logging_function_02._M_len = 10;
      LogPrintf_<double,double,double>
                (logging_function_02,source_file_03,0xc78,
                 IPC|I2P|QT|COINDB|LIBEVENT|PRUNE|RAND|REINDEX|SELECTCOINS|ADDRMAN|WALLETDB|ZMQ|
                 BENCH|MEMPOOL|TOR|NET,level,(char *)&pblockNew,(double *)&local_78,pdVar14,
                 (double *)state);
    }
    pcVar13 = (char *)0x0;
    bVar4 = FlushStateToDisk(this,state,IF_NEEDED,0);
    if (bVar4) {
      lVar8 = std::chrono::_V2::steady_clock::now();
      pdVar1 = &this->m_chainman->time_chainstate;
      pdVar1->__r = pdVar1->__r + (lVar8 - lVar7);
      pdVar14 = (double *)0x8be755;
      bVar4 = ::LogAcceptCategory(BENCH,Debug);
      if (bVar4) {
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar8 - lVar7) / 1000000.0);
        dVar12 = (double)(this->m_chainman->time_chainstate).__r;
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(dVar12 / 1000000000.0);
        local_78._M_dataplus._M_p =
             (pointer)((dVar12 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
        source_file_04._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_04._M_len = 0x57;
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
        logging_function_03._M_str = "ConnectTip";
        logging_function_03._M_len = 10;
        LogPrintf_<double,double,double>
                  (logging_function_03,source_file_04,0xc82,
                   IPC|I2P|QT|COINDB|LIBEVENT|PRUNE|RAND|REINDEX|SELECTCOINS|ADDRMAN|RPC|BENCH|HTTP|
                   MEMPOOL|TOR|NET,level,(char *)&pblockNew,(double *)&local_78,pdVar14,
                   (double *)state);
      }
      if (this->m_mempool != (CTxMemPool *)0x0) {
        CTxMemPool::removeForBlock(this->m_mempool,&block->vtx,pindexNew->nHeight);
        DisconnectedBlockTransactions::removeForBlock(disconnectpool,&block->vtx);
      }
      CChain::SetTip(&this->m_chain,pindexNew);
      UpdateTip(this,pindexNew);
      lVar7 = std::chrono::_V2::steady_clock::now();
      pCVar3 = this->m_chainman;
      pdVar1 = &pCVar3->time_post_connect;
      pdVar1->__r = pdVar1->__r + (lVar7 - lVar8);
      pdVar1 = &pCVar3->time_total;
      pdVar1->__r = pdVar1->__r + (lVar7 - lVar6);
      pdVar14 = (double *)0x8be864;
      bVar4 = ::LogAcceptCategory(BENCH,Debug);
      if (bVar4) {
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar7 - lVar8) / 1000000.0);
        dVar12 = (double)(this->m_chainman->time_post_connect).__r;
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(dVar12 / 1000000000.0);
        local_78._M_dataplus._M_p =
             (pointer)((dVar12 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
        source_file_05._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_05._M_len = 0x57;
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
        logging_function_04._M_str = "ConnectTip";
        logging_function_04._M_len = 10;
        LogPrintf_<double,double,double>
                  (logging_function_04,source_file_05,0xc92,
                   IPC|I2P|QT|COINDB|LIBEVENT|PRUNE|RAND|REINDEX|SELECTCOINS|ADDRMAN|RPC|WALLETDB|
                   BENCH|MEMPOOL,level,(char *)&pblockNew,(double *)&local_78,pdVar14,
                   (double *)state);
      }
      pdVar14 = (double *)0x8be907;
      bVar4 = ::LogAcceptCategory(BENCH,Debug);
      if (bVar4) {
        view.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
             (_func_int **)((double)(lVar7 - lVar6) / 1000000.0);
        dVar12 = (double)(this->m_chainman->time_total).__r;
        pblockNew.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(dVar12 / 1000000000.0);
        local_78._M_dataplus._M_p =
             (pointer)((dVar12 / 1000000.0) / (double)this->m_chainman->num_blocks_total);
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_06._M_len = 0x57;
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
        logging_function_05._M_str = "ConnectTip";
        logging_function_05._M_len = 10;
        LogPrintf_<double,double,double>
                  (logging_function_05,source_file_06,0xc96,
                   IPC|I2P|QT|COINDB|LIBEVENT|PRUNE|RAND|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|
                   HTTP|TOR,level,(char *)&pblockNew,(double *)&local_78,pdVar14,(double *)state);
      }
      pCVar10 = ChainstateManager::ActiveChainstate(this->m_chainman);
      if (pCVar10 != this) {
        ChainstateManager::MaybeCompleteSnapshotValidation(this->m_chainman);
      }
      local_328 = pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Stack_320._M_pi =
           pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar13;
      pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_328;
      ConnectTrace::BlockConnected(connectTrace,pindexNew,pblock_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_320);
      unaff_R12B = 1;
    }
    else {
      unaff_R12B = 0;
    }
  }
LAB_008be9f4:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pthisBlock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(unaff_R12B & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ConnectTip(BlockValidationState& state, CBlockIndex* pindexNew, const std::shared_ptr<const CBlock>& pblock, ConnectTrace& connectTrace, DisconnectedBlockTransactions& disconnectpool)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    assert(pindexNew->pprev == m_chain.Tip());
    // Read block from disk.
    const auto time_1{SteadyClock::now()};
    std::shared_ptr<const CBlock> pthisBlock;
    if (!pblock) {
        std::shared_ptr<CBlock> pblockNew = std::make_shared<CBlock>();
        if (!m_blockman.ReadBlockFromDisk(*pblockNew, *pindexNew)) {
            return FatalError(m_chainman.GetNotifications(), state, _("Failed to read block."));
        }
        pthisBlock = pblockNew;
    } else {
        LogDebug(BCLog::BENCH, "  - Using cached block\n");
        pthisBlock = pblock;
    }
    const CBlock& blockConnecting = *pthisBlock;
    // Apply the block atomically to the chain state.
    const auto time_2{SteadyClock::now()};
    SteadyClock::time_point time_3;
    // When adding aggregate statistics in the future, keep in mind that
    // num_blocks_total may be zero until the ConnectBlock() call below.
    LogDebug(BCLog::BENCH, "  - Load block from disk: %.2fms\n",
             Ticks<MillisecondsDouble>(time_2 - time_1));
    {
        CCoinsViewCache view(&CoinsTip());
        bool rv = ConnectBlock(blockConnecting, state, pindexNew, view);
        if (m_chainman.m_options.signals) {
            m_chainman.m_options.signals->BlockChecked(blockConnecting, state);
        }
        if (!rv) {
            if (state.IsInvalid())
                InvalidBlockFound(pindexNew, state);
            LogError("%s: ConnectBlock %s failed, %s\n", __func__, pindexNew->GetBlockHash().ToString(), state.ToString());
            return false;
        }
        time_3 = SteadyClock::now();
        m_chainman.time_connect_total += time_3 - time_2;
        assert(m_chainman.num_blocks_total > 0);
        LogDebug(BCLog::BENCH, "  - Connect total: %.2fms [%.2fs (%.2fms/blk)]\n",
                 Ticks<MillisecondsDouble>(time_3 - time_2),
                 Ticks<SecondsDouble>(m_chainman.time_connect_total),
                 Ticks<MillisecondsDouble>(m_chainman.time_connect_total) / m_chainman.num_blocks_total);
        bool flushed = view.Flush();
        assert(flushed);
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_flush += time_4 - time_3;
    LogDebug(BCLog::BENCH, "  - Flush: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_4 - time_3),
             Ticks<SecondsDouble>(m_chainman.time_flush),
             Ticks<MillisecondsDouble>(m_chainman.time_flush) / m_chainman.num_blocks_total);
    // Write the chain state to disk, if necessary.
    if (!FlushStateToDisk(state, FlushStateMode::IF_NEEDED)) {
        return false;
    }
    const auto time_5{SteadyClock::now()};
    m_chainman.time_chainstate += time_5 - time_4;
    LogDebug(BCLog::BENCH, "  - Writing chainstate: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_chainstate),
             Ticks<MillisecondsDouble>(m_chainman.time_chainstate) / m_chainman.num_blocks_total);
    // Remove conflicting transactions from the mempool.;
    if (m_mempool) {
        m_mempool->removeForBlock(blockConnecting.vtx, pindexNew->nHeight);
        disconnectpool.removeForBlock(blockConnecting.vtx);
    }
    // Update m_chain & related variables.
    m_chain.SetTip(*pindexNew);
    UpdateTip(pindexNew);

    const auto time_6{SteadyClock::now()};
    m_chainman.time_post_connect += time_6 - time_5;
    m_chainman.time_total += time_6 - time_1;
    LogDebug(BCLog::BENCH, "  - Connect postprocess: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_post_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_post_connect) / m_chainman.num_blocks_total);
    LogDebug(BCLog::BENCH, "- Connect block: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_total),
             Ticks<MillisecondsDouble>(m_chainman.time_total) / m_chainman.num_blocks_total);

    // If we are the background validation chainstate, check to see if we are done
    // validating the snapshot (i.e. our tip has reached the snapshot's base block).
    if (this != &m_chainman.ActiveChainstate()) {
        // This call may set `m_disabled`, which is referenced immediately afterwards in
        // ActivateBestChain, so that we stop connecting blocks past the snapshot base.
        m_chainman.MaybeCompleteSnapshotValidation();
    }

    connectTrace.BlockConnected(pindexNew, std::move(pthisBlock));
    return true;
}